

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedPumpTo::write
          (BlockedPumpTo *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  AsyncCapabilityStream *pAVar2;
  PromiseArena *pPVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  bool *pbVar6;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> OVar7;
  void *pvVar8;
  ulong uVar9;
  size_t sVar10;
  undefined4 in_register_00000034;
  AsyncPipe *pAVar11;
  ulong *puVar12;
  TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1280:50),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:465:12)>
  *location_02;
  TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1289:50),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:430:12)>
  *location_03;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1299:36)>
  *location_04;
  TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1313:54),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:430:12)>
  *location_05;
  bool bVar13;
  OwnPromiseNode intermediate;
  OwnPromiseNode intermediate_1;
  DebugExpression<bool> _kjCondition;
  void *continuationTracePtr;
  Fault f;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_f0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_e8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_e0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_d8;
  anon_class_24_2_c249a869_for_func local_d0;
  anon_class_16_2_d8ee3cd1 local_b8;
  DebugComparison<unsigned_long_&,_unsigned_long> local_a8;
  bool *local_80;
  AsyncPipe *local_78;
  OwnPromiseNode local_70;
  OwnPromiseNode local_68;
  OwnPromiseNode local_60;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_58;
  BlockedPumpTo *local_50;
  void *local_48;
  ulong local_40;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1276:36)>
  *local_38;
  
  pAVar11 = (AsyncPipe *)CONCAT44(in_register_00000034,__fd);
  bVar13 = *(long *)&pAVar11->readAborted == 0;
  local_d0.pipeRef = (AsyncPipe *)CONCAT71(local_d0.pipeRef._1_7_,bVar13);
  if (!bVar13) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              ((Fault *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x4ee,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",
               (DebugExpression<bool> *)&local_d0,(char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal((Fault *)&local_a8);
  }
  pbVar6 = &pAVar11->readAborted;
  local_a8.right = (long)(pAVar11->ownState).disposer - (long)(pAVar11->ownState).ptr;
  puVar12 = (ulong *)((long)__buf + 8);
  local_40 = 0;
  sVar10 = 0;
  uVar9 = local_a8.right;
  while( true ) {
    local_78 = pAVar11;
    if (__n == sVar10) {
      local_a8.left = &local_40;
      local_a8.op.content.ptr = " <= ";
      local_a8.op.content.size_ = 5;
      local_a8.result = local_40 <= local_a8.right;
      if (local_40 <= local_a8.right) {
        pAVar2 = (pAVar11->state).ptr;
        (*(pAVar2->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[1])
                  (&local_f0,pAVar2,__buf,__n);
        local_a8.right = local_40;
        local_d0.pipeRef = (AsyncPipe *)(pAVar11->super_Refcounted).super_Disposer._vptr_Disposer;
        local_b8.fulfiller =
             (PromiseFulfiller<unsigned_long> *)
             kj::_::
             TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1313:54),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:430:12)>
             ::anon_class_16_2_3fe5c9bc_for_func::operator();
        pPVar3 = ((local_f0.ptr)->super_PromiseArenaMember).arena;
        local_d0.remainder.ptr = (ArrayPtr<const_unsigned_char> *)pbVar6;
        local_a8.left = (unsigned_long *)pAVar11;
        if (pPVar3 == (PromiseArena *)0x0 || (ulong)((long)local_f0.ptr - (long)pPVar3) < 0x40) {
          pvVar8 = operator_new(0x400);
          location_05 = (TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1313:54),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:430:12)>
                         *)((long)pvVar8 + 0x3c0);
          ctor<kj::_::TransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_5_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionVoid<kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_5_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionVoid<kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_,void*&>
                    (location_05,&local_f0,(anon_class_16_2_3fe5c9bc_for_func *)&local_a8,
                     (anon_class_16_2_d8ee3cd1 *)&local_d0,&local_b8.fulfiller);
          *(void **)((long)pvVar8 + 0x3c8) = pvVar8;
        }
        else {
          ((local_f0.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
          location_05 = (TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1313:54),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:430:12)>
                         *)(local_f0.ptr + -4);
          ctor<kj::_::TransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_5_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionVoid<kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_5_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionVoid<kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_,void*&>
                    (location_05,&local_f0,(anon_class_16_2_3fe5c9bc_for_func *)&local_a8,
                     (anon_class_16_2_d8ee3cd1 *)&local_d0,&local_b8.fulfiller);
          local_f0.ptr[-4].super_PromiseArenaMember.arena = pPVar3;
        }
        local_e8.ptr = (PromiseNode *)0x0;
        local_d8.ptr = (PromiseNode *)0x0;
        local_70.ptr = (PromiseNode *)location_05;
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_d8);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_e8);
        newAdaptedPromise<void,kj::Canceler::AdapterImpl<void>,kj::Canceler&,kj::Promise<void>>
                  ((kj *)this,(Canceler *)pbVar6,(Promise<void> *)&local_70);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_70);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_f0);
        return (ssize_t)this;
      }
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&>
                ((Fault *)&local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x520,FAILED,"size <= amount - pumpedSoFar","_kjCondition,",&local_a8);
      kj::_::Debug::Fault::fatal((Fault *)&local_d0);
    }
    uVar1 = *puVar12;
    if (uVar9 < uVar1) break;
    local_40 = uVar1 + local_40;
    sVar10 = sVar10 + 1;
    puVar12 = puVar12 + 2;
    uVar9 = uVar9 - uVar1;
  }
  local_80 = pbVar6;
  local_48 = __buf;
  (*(((pAVar11->state).ptr)->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[1])
            ();
  if (uVar9 == 0) {
    local_a8.left = (unsigned_long *)(pAVar11->super_Refcounted).super_Disposer._vptr_Disposer;
    local_a8.right = (unsigned_long)local_80;
    local_d0.pipeRef =
         (AsyncPipe *)
         kj::_::
         TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1289:50),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:430:12)>
         ::anon_class_8_1_8991fb9c_for_func::operator();
    pp_Var4 = (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
              _vptr_AsyncInputStream;
    p_Var5 = pp_Var4[1];
    local_f0.ptr = (PromiseNode *)pAVar11;
    if (p_Var5 == (_func_int *)0x0 || (ulong)((long)pp_Var4 - (long)p_Var5) < 0x38) {
      pvVar8 = operator_new(0x400);
      location_03 = (TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1289:50),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:430:12)>
                     *)((long)pvVar8 + 0x3c8);
      ctor<kj::_::TransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_3_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionVoid<kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_3_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionVoid<kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_,void*&>
                (location_03,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this,
                 (anon_class_8_1_8991fb9c_for_func *)&local_f0,(anon_class_16_2_d8ee3cd1 *)&local_a8
                 ,&local_d0.pipeRef);
      *(void **)((long)pvVar8 + 0x3d0) = pvVar8;
    }
    else {
      pp_Var4[1] = (_func_int *)0x0;
      location_03 = (TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1289:50),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:430:12)>
                     *)(pp_Var4 + -7);
      ctor<kj::_::TransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_3_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionVoid<kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_3_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionVoid<kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_,void*&>
                (location_03,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this,
                 (anon_class_8_1_8991fb9c_for_func *)&local_f0,(anon_class_16_2_d8ee3cd1 *)&local_a8
                 ,&local_d0.pipeRef);
      pp_Var4[-6] = p_Var5;
    }
    local_b8.fulfiller = (PromiseFulfiller<unsigned_long> *)0x0;
    local_e8.ptr = (PromiseNode *)0x0;
    local_68.ptr = (PromiseNode *)location_03;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_e8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_b8);
    pvVar8 = local_48;
    newAdaptedPromise<void,kj::Canceler::AdapterImpl<void>,kj::Canceler&,kj::Promise<void>>
              ((kj *)&local_d8,(Canceler *)local_80,(Promise<void> *)&local_68);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this,&local_d8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_d8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_68);
  }
  else {
    local_d0.remainder.ptr = (ArrayPtr<const_unsigned_char> *)puVar12[-1];
    local_b8.fulfiller =
         (PromiseFulfiller<unsigned_long> *)
         kj::_::
         SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1276:36)>
         ::anon_class_24_2_9ee7ec2e_for_func::operator();
    pp_Var4 = (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
              _vptr_AsyncInputStream;
    p_Var5 = pp_Var4[1];
    local_d0.pipeRef = pAVar11;
    local_d0.remainder.size_ = uVar9;
    local_50 = this;
    if (p_Var5 == (_func_int *)0x0 || (ulong)((long)pp_Var4 - (long)p_Var5) < 0x38) {
      pvVar8 = operator_new(0x400);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_,void*&>
                ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1276:36)>
                  *)((long)pvVar8 + 0x3c8),(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this,
                 (anon_class_24_2_9ee7ec2e_for_func *)&local_d0,&local_b8.fulfiller);
      *(void **)((long)pvVar8 + 0x3d0) = pvVar8;
      local_e8.ptr = (PromiseNode *)((long)pvVar8 + 0x3c8);
    }
    else {
      pp_Var4[1] = (_func_int *)0x0;
      local_38 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1276:36)>
                  *)(pp_Var4 + -7);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_,void*&>
                (local_38,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this,
                 (anon_class_24_2_9ee7ec2e_for_func *)&local_d0,&local_b8.fulfiller);
      pp_Var4[-6] = p_Var5;
      local_e8.ptr = (PromiseNode *)local_38;
    }
    this = local_50;
    local_a8.left = (unsigned_long *)&DAT_0042a172;
    local_a8.right = (unsigned_long)&DAT_0042a1d1;
    local_a8.op.content.ptr = (char *)0x4c0000058b;
    location.function = &DAT_0042a1d1;
    location.fileName = &DAT_0042a172;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    kj::_::maybeChain<void>(&local_f0,(Promise<void> *)&local_e8,location);
    OVar7.ptr = local_f0.ptr;
    local_f0.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_f0);
    local_e0.ptr = OVar7.ptr;
    local_d8.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_d8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_e8);
    pbVar6 = local_80;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this,&local_e0);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_e0);
    local_d0.remainder.ptr = (ArrayPtr<const_unsigned_char> *)(uVar9 + puVar12[-1]);
    local_d0.remainder.size_ = *puVar12 - uVar9;
    local_d0.pipeRef = local_78;
    local_b8.fulfiller =
         (PromiseFulfiller<unsigned_long> *)
         (local_78->super_Refcounted).super_Disposer._vptr_Disposer;
    local_b8.canceler = (Canceler *)pbVar6;
    local_a8.left = (unsigned_long *)0x4e0aab;
    local_a8.right = 0x4a33ea;
    local_a8.op.content.ptr = (char *)0x2500000500;
    local_e8.ptr = (PromiseNode *)
                   kj::_::
                   TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1280:50),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
                   ::anon_class_24_2_79c18d0c_for_func::operator();
    pp_Var4 = (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
              _vptr_AsyncInputStream;
    p_Var5 = pp_Var4[1];
    if (p_Var5 == (_func_int *)0x0 || (ulong)((long)pp_Var4 - (long)p_Var5) < 0x48) {
      pvVar8 = operator_new(0x400);
      location_02 = (TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1280:50),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:465:12)>
                     *)((long)pvVar8 + 0x3b8);
      ctor<kj::_::TransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_2_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionPromise<void,kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_2_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionPromise<void,kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_,void*&>
                (location_02,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this,
                 (anon_class_24_2_79c18d0c_for_func *)&local_d0,&local_b8,&local_e8.ptr);
      *(void **)((long)pvVar8 + 0x3c0) = pvVar8;
    }
    else {
      pp_Var4[1] = (_func_int *)0x0;
      location_02 = (TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1280:50),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:465:12)>
                     *)(pp_Var4 + -9);
      ctor<kj::_::TransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_2_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionPromise<void,kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_2_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionPromise<void,kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_,void*&>
                (location_02,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this,
                 (anon_class_24_2_79c18d0c_for_func *)&local_d0,&local_b8,&local_e8.ptr);
      pp_Var4[-8] = p_Var5;
    }
    location_00.function = (char *)local_a8.right;
    location_00.fileName = (char *)local_a8.left;
    location_00._16_8_ = local_a8.op.content.ptr;
    local_d8.ptr = (PromiseNode *)location_02;
    kj::_::maybeChain<void>(&local_e0,(Promise<void> *)&local_d8,location_00);
    OVar7.ptr = local_e0.ptr;
    local_e0.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_e0);
    local_60.ptr = OVar7.ptr;
    local_f0.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_f0);
    pvVar8 = local_48;
    pbVar6 = local_80;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_d8);
    newAdaptedPromise<void,kj::Canceler::AdapterImpl<void>,kj::Canceler&,kj::Promise<void>>
              ((kj *)&local_58,(Canceler *)pbVar6,(Promise<void> *)&local_60);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this,&local_58);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_58);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_60);
    sVar10 = sVar10 + 1;
  }
  local_d0.remainder.size_ = __n - sVar10;
  if (local_d0.remainder.size_ == 0) {
    return (ssize_t)this;
  }
  local_d0.remainder.ptr = (ArrayPtr<const_unsigned_char> *)((long)pvVar8 + sVar10 * 0x10);
  local_d0.pipeRef = *(AsyncPipe **)&(local_78->super_Refcounted).refcount;
  local_b8.fulfiller =
       (PromiseFulfiller<unsigned_long> *)
       kj::_::
       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1299:36)>
       ::anon_class_24_2_c249a869_for_func::operator();
  pp_Var4 = (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
            _vptr_AsyncInputStream;
  p_Var5 = pp_Var4[1];
  if (p_Var5 == (_func_int *)0x0 || (ulong)((long)pp_Var4 - (long)p_Var5) < 0x38) {
    pvVar8 = operator_new(0x400);
    location_04 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1299:36)>
                   *)((long)pvVar8 + 0x3c8);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_4_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_4_,void*&>
              (location_04,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this,&local_d0,
               &local_b8.fulfiller);
    *(void **)((long)pvVar8 + 0x3d0) = pvVar8;
  }
  else {
    pp_Var4[1] = (_func_int *)0x0;
    location_04 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1299:36)>
                   *)(pp_Var4 + -7);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_4_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_4_,void*&>
              (location_04,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this,&local_d0,
               &local_b8.fulfiller);
    pp_Var4[-6] = p_Var5;
  }
  local_a8.left = (unsigned_long *)&DAT_0042a172;
  local_a8.right = (unsigned_long)&DAT_0042a1d1;
  local_a8.op.content.ptr = (char *)0x4c0000058b;
  location_01.function = &DAT_0042a1d1;
  location_01.fileName = &DAT_0042a172;
  location_01.lineNumber = 0x58b;
  location_01.columnNumber = 0x4c;
  local_e8.ptr = (PromiseNode *)location_04;
  kj::_::maybeChain<void>(&local_f0,(Promise<void> *)&local_e8,location_01);
  OVar7.ptr = local_f0.ptr;
  local_f0.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_f0);
  local_e0.ptr = OVar7.ptr;
  local_d8.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_d8);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_e8);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this,&local_e0);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_e0);
  return (ssize_t)this;
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}